

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::initTest
          (TessellationShaderTessellationInputPatchDiscard *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TessellationShaderUtils *this_01;
  undefined1 local_94 [8];
  _run run;
  _tessellation_primitive_mode primitive_mode;
  uint n_primitive_mode;
  uint n_primitive_modes;
  _tessellation_primitive_mode primitive_modes [3];
  uint n_shaders;
  GLuint shaders [2];
  char *vs_body;
  char *fs_body;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTessellationInputPatchDiscard *local_10;
  TessellationShaderTessellationInputPatchDiscard *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    gl._3_1_ = 1;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    gl._3_1_ = 0;
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  fs_body = (char *)CONCAT44(extraout_var,iVar1);
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils
            (this_01,(Functions *)fs_body,&this->super_TestCaseBase);
  this->m_utils_ptr = this_01;
  (**(code **)(fs_body + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x1cb);
  (**(code **)(fs_body + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x1ce);
  (**(code **)(fs_body + 0x6c8))(1,&this->m_bo_id);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x1d1);
  GVar3 = (**(code **)(fs_body + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(fs_body + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x1d5);
  vs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&vs_body);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glShaderSource() failed for fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x1df);
  shaders = (GLuint  [2])anon_var_dwarf_64e923;
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,this->m_vs_id,1,(GLchar **)shaders);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glShaderSource() failed for vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x1ea);
  primitive_modes[2] = this->m_fs_id;
  primitive_modes[1] = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
  TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,primitive_modes + 2,true);
  _n_primitive_mode = 0x200000000;
  primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
  for (run.te_id = 0; run.te_id < 3; run.te_id = run.te_id + 1) {
    run.tc_id = (&n_primitive_mode)[run.te_id];
    _run::_run((_run *)local_94);
    initRun(this,(_run *)local_94,run.tc_id);
    std::
    vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
    ::push_back(&this->m_runs,(value_type *)local_94);
  }
  (**(code **)(fs_body + 0x40))(0x8c8e,this->m_bo_id);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x208);
  (**(code **)(fs_body + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glBindBufferBase() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x20b);
  return;
}

Assistant:

void TessellationShaderTessellationInputPatchDiscard::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate all test-wide objects needed for test execution */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	m_utils_ptr				 = new TessellationShaderUtils(gl, this);

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	m_utils_ptr->compileShaders(n_shaders, shaders, true);

	/* Initialize all the runs. */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		/* Initialize the run */
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];
		_run						 run;

		initRun(run, primitive_mode);

		/* Store the run */
		m_runs.push_back(run);
	} /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}